

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOf
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *pQVar1;
  long *plVar2;
  QWidget *pQVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar5) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    pQVar1 = (this->item_list).d.ptr;
    if (*(long *)((long)&pQVar1->placeHolderItem + lVar4) == 0) {
      if (*(long *)((long)&pQVar1->subinfo + lVar4) == 0) {
        if ((((*(byte *)((long)&pQVar1->flags + lVar4) & 1) == 0) &&
            (plVar2 = *(long **)((long)&pQVar1->widgetItem + lVar4), plVar2 != (long *)0x0)) &&
           (pQVar3 = (QWidget *)(**(code **)(*plVar2 + 0x68))(), pQVar3 == widget)) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (int *)0x0;
          (__return_storage_ptr__->d).size = 0;
          QList<int>::append(__return_storage_ptr__,(parameter_type)uVar5);
          return __return_storage_ptr__;
        }
      }
      else {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        indexOf(__return_storage_ptr__,*(QDockAreaLayoutInfo **)((long)&pQVar1->subinfo + lVar4),
                widget);
        if ((__return_storage_ptr__->d).size != 0) {
          QList<int>::prepend(__return_storage_ptr__,(parameter_type)uVar5);
          return __return_storage_ptr__;
        }
        QArrayDataPointer<int>::~QArrayDataPointer(&__return_storage_ptr__->d);
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x28;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOf(const QWidget *widget) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.placeHolderItem != nullptr)
            continue;

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOf(widget);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (!(item.flags & QDockAreaLayoutItem::GapItem) && item.widgetItem && item.widgetItem->widget() == widget) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}